

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O2

void __thiscall cmDebugServerJson::cmDebugServerJson(cmDebugServerJson *this,cmDebugger *debugger)

{
  cmConnection *conn;
  cmConnectionBufferStrategy *bufferStrategy;
  
  conn = (cmConnection *)operator_new(0x48);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy[4]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[3]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_0064fa20;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmStdIoConnection::cmStdIoConnection((cmStdIoConnection *)conn,bufferStrategy);
  cmDebugServerJson(this,debugger,conn);
  return;
}

Assistant:

cmDebugServerJson::cmDebugServerJson(cmDebugger& debugger)
  : cmDebugServerJson(debugger,
                      new cmStdIoConnection(new cmServerBufferStrategy()))
{
}